

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PreIncTestUint32(void)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar4;
  SafeIntException *anon_var_0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [43];
  uint in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_10;
  byte local_9;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    local_9 = 1;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_10,(uint *)(inc_uint32 + local_8 * 0xc));
    pSVar4 = SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator++((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                           *)in_stack_ffffffffffffff90);
    unique0x00011f80 = pSVar4->m_int;
    bVar3 = operator!=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )(uint)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (uint)in_stack_ffffffffffffff90);
    if (bVar3) {
      local_9 = 0;
    }
    if ((local_9 & 1) != (inc_uint32[local_8 * 0xc + 8] & 1)) {
      in_stack_ffffffffffffff90 = &local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50,"Error in case inc_uint32 throw (1): ",in_stack_ffffffffffffff90);
      uVar2 = stack0xffffffffffffffd8;
      uVar1 = stack0xffffffffffffffd8 >> 0x18;
      bVar3 = SUB41(uVar1,0);
      unique0x10000139 = uVar2;
      err_msg<unsigned_int>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,bVar3);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
  }
  return;
}

Assistant:

void PreIncTestUint32()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_uint32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint32_t> si(inc_uint32[i].x);
			SafeInt<std::uint32_t> vv = ++si;

			if(vv != inc_uint32[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_uint32[i].fExpected )
		{
			err_msg( "Error in case inc_uint32 throw (1): ", inc_uint32[i].x, inc_uint32[i].fExpected );
		}
	}
}